

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx *dctx,size_t maxWindowSize)

{
  size_t sStack_8;
  
  if (dctx->streamStage == zdss_init) {
    if (0xffffffff800003fe < maxWindowSize - 0x80000001) {
      dctx->maxWindowSize = maxWindowSize;
      return 0;
    }
    sStack_8 = 0xffffffffffffffd6;
  }
  else {
    sStack_8 = 0xffffffffffffffc4;
  }
  return sStack_8;
}

Assistant:

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx* dctx, size_t maxWindowSize)
{
    ZSTD_bounds const bounds = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
    size_t const min = (size_t)1 << bounds.lowerBound;
    size_t const max = (size_t)1 << bounds.upperBound;
    if (dctx->streamStage != zdss_init) return ERROR(stage_wrong);
    if (maxWindowSize < min) return ERROR(parameter_outOfBound);
    if (maxWindowSize > max) return ERROR(parameter_outOfBound);
    dctx->maxWindowSize = maxWindowSize;
    return 0;
}